

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O3

vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_> *
ExprEval::Operator::get_spec_table(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  time_t tVar5;
  Specification spec_ln;
  Specification spec_not;
  Specification spec_or;
  Specification spec_mod;
  Specification spec_pow;
  Specification spec_divide;
  Specification spec_multiply;
  Specification spec_subtract;
  Specification spec_shiftr;
  Specification spec_shiftl;
  Specification spec_rand;
  Specification spec_gamma;
  Specification spec_abs;
  Specification spec_ceil;
  Specification spec_floor;
  Specification spec_round;
  Specification spec_atanh;
  Specification spec_acosh;
  Specification spec_asinh;
  Specification spec_atan;
  Specification spec_acos;
  Specification spec_asin;
  Specification spec_tanh;
  Specification spec_cosh;
  Specification spec_sinh;
  Specification spec_cot;
  Specification spec_tan;
  Specification spec_cos;
  Specification spec_sin;
  Specification spec_log10;
  Specification spec_log2;
  Specification spec_xor;
  Specification spec_and;
  Specification spec_add;
  Specification spec_pi;
  Specification spec_false;
  Specification spec_true;
  Specification spec_e;
  int local_1334;
  value_type local_1330;
  value_type local_12b0;
  value_type local_1230;
  value_type local_11b0;
  value_type local_1130;
  value_type local_10b0;
  value_type local_1030;
  value_type local_fb0;
  value_type local_f30;
  value_type local_eb0;
  value_type local_e30;
  value_type local_db0;
  value_type local_d30;
  value_type local_cb0;
  value_type local_c30;
  value_type local_bb0;
  value_type local_b30;
  value_type local_ab0;
  value_type local_a30;
  value_type local_9b0;
  value_type local_930;
  value_type local_8b0;
  value_type local_830;
  value_type local_7b0;
  value_type local_730;
  value_type local_6b0;
  value_type local_630;
  value_type local_5b0;
  value_type local_530;
  value_type local_4b0;
  value_type local_430;
  value_type local_3b0;
  value_type local_330;
  value_type local_2b0;
  value_type local_230;
  value_type local_1b0;
  value_type local_130;
  value_type local_b0;
  
  if (specification_table ==
      (vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
       *)0x0) {
    tVar5 = time((time_t *)0x0);
    srand((uint)tVar5);
    specification_table =
         (vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
          *)operator_new(0x18);
    (specification_table->
    super__Vector_base<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (specification_table->
    super__Vector_base<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (specification_table->
    super__Vector_base<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2b0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_2b0.symbol._M_dataplus._M_p = (pointer)&local_2b0.symbol.field_2;
    local_2b0.symbol._M_string_length = 0;
    local_2b0.symbol.field_2._M_local_buf[0] = '\0';
    local_2b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_2b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_2b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_2b0.symbol,0,(char *)0x0,0x111593);
    local_2b0.priority = 9;
    local_2b0.n_arg = 2;
    local_fb0.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 0xffffffff;
    if (local_2b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_2b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_2b0.arg_positions,
                 (iterator)
                 local_2b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_fb0);
    }
    else {
      *local_2b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = -1;
      local_2b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_2b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_fb0.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_2b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_2b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_2b0.arg_positions,
                 (iterator)
                 local_2b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_fb0);
    }
    else {
      *local_2b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_2b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_2b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_fb0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_fb0.symbol._M_dataplus._M_p = (pointer)&local_fb0.symbol.field_2;
    local_fb0.symbol._M_string_length = 0;
    local_fb0.symbol.field_2._M_local_buf[0] = '\0';
    local_fb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_fb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_fb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_fb0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_fb0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_fb0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_fb0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_fb0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_fb0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_fb0.symbol,0,(char *)0x0,0x111595);
    local_fb0.priority = 9;
    local_fb0.n_arg = 2;
    local_1030.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 0xffffffff;
    if (local_fb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_fb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_fb0.arg_positions,
                 (iterator)
                 local_fb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_1030);
    }
    else {
      *local_fb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = -1;
      local_fb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_fb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_1030.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_fb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_fb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_fb0.arg_positions,
                 (iterator)
                 local_fb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_1030);
    }
    else {
      *local_fb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_fb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_fb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_1030.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_1030.symbol._M_dataplus._M_p = (pointer)&local_1030.symbol.field_2;
    local_1030.symbol._M_string_length = 0;
    local_1030.symbol.field_2._M_local_buf[0] = '\0';
    local_1030.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1030.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_1030.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_1030.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1030.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1030.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1030.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1030.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1030.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_1030.symbol,0,(char *)0x0,0x111597);
    local_1030.priority = 8;
    local_1030.n_arg = 2;
    local_10b0.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 0xffffffff;
    if (local_1030.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_1030.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_1030.arg_positions,
                 (iterator)
                 local_1030.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_10b0);
    }
    else {
      *local_1030.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = -1;
      local_1030.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_1030.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_10b0.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_1030.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_1030.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_1030.arg_positions,
                 (iterator)
                 local_1030.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_10b0);
    }
    else {
      *local_1030.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_1030.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_1030.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_10b0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_10b0.symbol._M_dataplus._M_p = (pointer)&local_10b0.symbol.field_2;
    local_10b0.symbol._M_string_length = 0;
    local_10b0.symbol.field_2._M_local_buf[0] = '\0';
    local_10b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_10b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_10b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_10b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_10b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_10b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_10b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_10b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_10b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_10b0.symbol,0,(char *)0x0,0x111599);
    local_10b0.priority = 8;
    local_10b0.n_arg = 2;
    local_1130.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 0xffffffff;
    if (local_10b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_10b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_10b0.arg_positions,
                 (iterator)
                 local_10b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_1130);
    }
    else {
      *local_10b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = -1;
      local_10b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_10b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_1130.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_10b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_10b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_10b0.arg_positions,
                 (iterator)
                 local_10b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_1130);
    }
    else {
      *local_10b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_10b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_10b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_1130.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_1130.symbol._M_dataplus._M_p = (pointer)&local_1130.symbol.field_2;
    local_1130.symbol._M_string_length = 0;
    local_1130.symbol.field_2._M_local_buf[0] = '\0';
    local_1130.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1130.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_1130.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_1130.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1130.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1130.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1130.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1130.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1130.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_1130.symbol,0,(char *)0x0,0x11159b);
    local_1130.priority = 7;
    local_1130.n_arg = 2;
    local_11b0.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 0xffffffff;
    if (local_1130.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_1130.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_1130.arg_positions,
                 (iterator)
                 local_1130.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_11b0);
    }
    else {
      *local_1130.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = -1;
      local_1130.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_1130.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_11b0.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_1130.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_1130.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_1130.arg_positions,
                 (iterator)
                 local_1130.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_11b0);
    }
    else {
      *local_1130.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_1130.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_1130.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_11b0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_11b0.symbol._M_dataplus._M_p = (pointer)&local_11b0.symbol.field_2;
    local_11b0.symbol._M_string_length = 0;
    local_11b0.symbol.field_2._M_local_buf[0] = '\0';
    local_11b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_11b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_11b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_11b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_11b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_11b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_11b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_11b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_11b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_11b0.symbol,0,(char *)0x0,0x11159d);
    local_11b0.priority = 7;
    local_11b0.n_arg = 2;
    local_1330.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 0xffffffff;
    if (local_11b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_11b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_11b0.arg_positions,
                 (iterator)
                 local_11b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_1330);
    }
    else {
      *local_11b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = -1;
      local_11b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_11b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_1330.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_11b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_11b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_11b0.arg_positions,
                 (iterator)
                 local_11b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_1330);
    }
    else {
      *local_11b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_11b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_11b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_1330.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_1330.symbol._M_dataplus._M_p = (pointer)&local_1330.symbol.field_2;
    local_1330.symbol._M_string_length = 0;
    local_1330.symbol.field_2._M_local_buf[0] = '\0';
    local_1330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_1330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_1330.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1330.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1330.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1330.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1330.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1330.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_1330.symbol,0,(char *)0x0,0x1115a1);
    local_1330.priority = 6;
    local_1330.n_arg = 1;
    local_430.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_1330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_1330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_1330.arg_positions,
                 (iterator)
                 local_1330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_430);
    }
    else {
      *local_1330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_1330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_1330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_430.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_430.symbol._M_dataplus._M_p = (pointer)&local_430.symbol.field_2;
    local_430.symbol._M_string_length = 0;
    local_430.symbol.field_2._M_local_buf[0] = '\0';
    local_430.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_430.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_430.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_430.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_430.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_430.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_430.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_430.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_430.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_430.symbol,0,(char *)0x0,0x1115a4);
    local_430.priority = 6;
    local_430.n_arg = 1;
    local_4b0.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_430.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_430.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_430.arg_positions,
                 (iterator)
                 local_430.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_4b0);
    }
    else {
      *local_430.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_430.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_430.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_4b0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_4b0.symbol._M_dataplus._M_p = (pointer)&local_4b0.symbol.field_2;
    local_4b0.symbol._M_string_length = 0;
    local_4b0.symbol.field_2._M_local_buf[0] = '\0';
    local_4b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_4b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_4b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_4b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_4b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_4b0.symbol,0,(char *)0x0,0x1115a9);
    local_4b0.priority = 6;
    local_4b0.n_arg = 1;
    local_530.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_4b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_4b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_4b0.arg_positions,
                 (iterator)
                 local_4b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_530);
    }
    else {
      *local_4b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_4b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_4b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_530.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_530.symbol._M_dataplus._M_p = (pointer)&local_530.symbol.field_2;
    local_530.symbol._M_string_length = 0;
    local_530.symbol.field_2._M_local_buf[0] = '\0';
    local_530.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_530.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_530.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_530.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_530.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_530.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_530.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_530.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_530.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_530.symbol,0,(char *)0x0,0x1115b4);
    local_530.priority = 6;
    local_530.n_arg = 1;
    local_5b0.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_530.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_530.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_530.arg_positions,
                 (iterator)
                 local_530.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_5b0);
    }
    else {
      *local_530.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_530.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_530.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_5b0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_5b0.symbol._M_dataplus._M_p = (pointer)&local_5b0.symbol.field_2;
    local_5b0.symbol._M_string_length = 0;
    local_5b0.symbol.field_2._M_local_buf[0] = '\0';
    local_5b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_5b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_5b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_5b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_5b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_5b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_5b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_5b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_5b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_5b0.symbol,0,(char *)0x0,0x1115bb);
    local_5b0.priority = 6;
    local_5b0.n_arg = 1;
    local_630.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_5b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_5b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_5b0.arg_positions,
                 (iterator)
                 local_5b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_630);
    }
    else {
      *local_5b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_5b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_5b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_630.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_630.symbol._M_dataplus._M_p = (pointer)&local_630.symbol.field_2;
    local_630.symbol._M_string_length = 0;
    local_630.symbol.field_2._M_local_buf[0] = '\0';
    local_630.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_630.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_630.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_630.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_630.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_630.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_630.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_630.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_630.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_630.symbol,0,(char *)0x0,0x1115c2);
    local_630.priority = 6;
    local_630.n_arg = 1;
    local_6b0.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_630.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_630.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_630.arg_positions,
                 (iterator)
                 local_630.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_6b0);
    }
    else {
      *local_630.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_630.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_630.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_6b0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_6b0.symbol._M_dataplus._M_p = (pointer)&local_6b0.symbol.field_2;
    local_6b0.symbol._M_string_length = 0;
    local_6b0.symbol.field_2._M_local_buf[0] = '\0';
    local_6b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_6b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_6b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_6b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_6b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_6b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_6b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_6b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_6b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_6b0.symbol,0,(char *)0x0,0x1115ad);
    local_6b0.priority = 6;
    local_6b0.n_arg = 1;
    local_730.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_6b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_6b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_6b0.arg_positions,
                 (iterator)
                 local_6b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_730);
    }
    else {
      *local_6b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_6b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_6b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_730.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_730.symbol._M_dataplus._M_p = (pointer)&local_730.symbol.field_2;
    local_730.symbol._M_string_length = 0;
    local_730.symbol.field_2._M_local_buf[0] = '\0';
    local_730.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_730.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_730.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_730.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_730.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_730.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_730.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_730.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_730.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_730.symbol,0,(char *)0x0,0x1115c9);
    local_730.priority = 6;
    local_730.n_arg = 1;
    local_7b0.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_730.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_730.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_730.arg_positions,
                 (iterator)
                 local_730.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_7b0);
    }
    else {
      *local_730.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_730.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_730.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_7b0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_7b0.symbol._M_dataplus._M_p = (pointer)&local_7b0.symbol.field_2;
    local_7b0.symbol._M_string_length = 0;
    local_7b0.symbol.field_2._M_local_buf[0] = '\0';
    local_7b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_7b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_7b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_7b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_7b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_7b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_7b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_7b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_7b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_7b0.symbol,0,(char *)0x0,0x1115d1);
    local_7b0.priority = 6;
    local_7b0.n_arg = 1;
    local_830.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_7b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_7b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_7b0.arg_positions,
                 (iterator)
                 local_7b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_830);
    }
    else {
      *local_7b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_7b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_7b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_830.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_830.symbol._M_dataplus._M_p = (pointer)&local_830.symbol.field_2;
    local_830.symbol._M_string_length = 0;
    local_830.symbol.field_2._M_local_buf[0] = '\0';
    local_830.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_830.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_830.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_830.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_830.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_830.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_830.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_830.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_830.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_830.symbol,0,(char *)0x0,0x1115d9);
    local_830.priority = 6;
    local_830.n_arg = 1;
    local_8b0.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_830.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_830.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_830.arg_positions,
                 (iterator)
                 local_830.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_8b0);
    }
    else {
      *local_830.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_830.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_830.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_8b0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_8b0.symbol._M_dataplus._M_p = (pointer)&local_8b0.symbol.field_2;
    local_8b0.symbol._M_string_length = 0;
    local_8b0.symbol.field_2._M_local_buf[0] = '\0';
    local_8b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_8b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_8b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_8b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_8b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_8b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_8b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_8b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_8b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_8b0.symbol,0,(char *)0x0,0x1115b1);
    local_8b0.priority = 6;
    local_8b0.n_arg = 1;
    local_930.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_8b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_8b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_8b0.arg_positions,
                 (iterator)
                 local_8b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_930);
    }
    else {
      *local_8b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_8b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_8b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_930.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_930.symbol._M_dataplus._M_p = (pointer)&local_930.symbol.field_2;
    local_930.symbol._M_string_length = 0;
    local_930.symbol.field_2._M_local_buf[0] = '\0';
    local_930.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_930.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_930.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_930.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_930.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_930.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_930.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_930.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_930.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_930.symbol,0,(char *)0x0,0x1115b8);
    local_930.priority = 6;
    local_930.n_arg = 1;
    local_9b0.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_930.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_930.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_930.arg_positions,
                 (iterator)
                 local_930.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_9b0);
    }
    else {
      *local_930.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_930.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_930.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_9b0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_9b0.symbol._M_dataplus._M_p = (pointer)&local_9b0.symbol.field_2;
    local_9b0.symbol._M_string_length = 0;
    local_9b0.symbol.field_2._M_local_buf[0] = '\0';
    local_9b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_9b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_9b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_9b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_9b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_9b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_9b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_9b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_9b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_9b0.symbol,0,(char *)0x0,0x1115bf);
    local_9b0.priority = 6;
    local_9b0.n_arg = 1;
    local_a30.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_9b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_9b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_9b0.arg_positions,
                 (iterator)
                 local_9b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_a30);
    }
    else {
      *local_9b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_9b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_9b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_a30.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_a30.symbol._M_dataplus._M_p = (pointer)&local_a30.symbol.field_2;
    local_a30.symbol._M_string_length = 0;
    local_a30.symbol.field_2._M_local_buf[0] = '\0';
    local_a30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_a30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_a30.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a30.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a30.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_a30.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a30.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a30.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_a30.symbol,0,(char *)0x0,0x1115c6);
    local_a30.priority = 6;
    local_a30.n_arg = 1;
    local_ab0.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_a30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_a30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_a30.arg_positions,
                 (iterator)
                 local_a30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_ab0);
    }
    else {
      *local_a30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_a30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_a30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_ab0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_ab0.symbol._M_dataplus._M_p = (pointer)&local_ab0.symbol.field_2;
    local_ab0.symbol._M_string_length = 0;
    local_ab0.symbol.field_2._M_local_buf[0] = '\0';
    local_ab0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_ab0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_ab0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_ab0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_ab0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_ab0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_ab0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_ab0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_ab0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_ab0.symbol,0,(char *)0x0,0x1115ce);
    local_ab0.priority = 6;
    local_ab0.n_arg = 1;
    local_b30.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_ab0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_ab0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_ab0.arg_positions,
                 (iterator)
                 local_ab0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_b30);
    }
    else {
      *local_ab0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_ab0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_ab0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_b30.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_b30.symbol._M_dataplus._M_p = (pointer)&local_b30.symbol.field_2;
    local_b30.symbol._M_string_length = 0;
    local_b30.symbol.field_2._M_local_buf[0] = '\0';
    local_b30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_b30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_b30.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b30.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b30.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b30.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b30.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b30.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_b30.symbol,0,(char *)0x0,0x1115d6);
    local_b30.priority = 6;
    local_b30.n_arg = 1;
    local_bb0.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_b30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_b30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_b30.arg_positions,
                 (iterator)
                 local_b30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_bb0);
    }
    else {
      *local_b30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_b30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_b30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_bb0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_bb0.symbol._M_dataplus._M_p = (pointer)&local_bb0.symbol.field_2;
    local_bb0.symbol._M_string_length = 0;
    local_bb0.symbol.field_2._M_local_buf[0] = '\0';
    local_bb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_bb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_bb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_bb0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_bb0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_bb0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_bb0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_bb0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_bb0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_bb0.symbol,0,(char *)0x0,0x1115de);
    local_bb0.priority = 6;
    local_bb0.n_arg = 1;
    local_c30.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_bb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_bb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_bb0.arg_positions,
                 (iterator)
                 local_bb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_c30);
    }
    else {
      *local_bb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_bb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_bb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_c30.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_c30.symbol._M_dataplus._M_p = (pointer)&local_c30.symbol.field_2;
    local_c30.symbol._M_string_length = 0;
    local_c30.symbol.field_2._M_local_buf[0] = '\0';
    local_c30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_c30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_c30.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c30.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c30.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c30.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c30.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c30.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_c30.symbol,0,(char *)0x0,0x1115e4);
    local_c30.priority = 6;
    local_c30.n_arg = 1;
    local_cb0.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_c30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_c30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_c30.arg_positions,
                 (iterator)
                 local_c30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_cb0);
    }
    else {
      *local_c30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_c30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_c30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_cb0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_cb0.symbol._M_dataplus._M_p = (pointer)&local_cb0.symbol.field_2;
    local_cb0.symbol._M_string_length = 0;
    local_cb0.symbol.field_2._M_local_buf[0] = '\0';
    local_cb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_cb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_cb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_cb0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_cb0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_cb0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_cb0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_cb0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_cb0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_cb0.symbol,0,(char *)0x0,0x1115ea);
    local_cb0.priority = 6;
    local_cb0.n_arg = 1;
    local_d30.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_cb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_cb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_cb0.arg_positions,
                 (iterator)
                 local_cb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_d30);
    }
    else {
      *local_cb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_cb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_cb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_d30.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_d30.symbol._M_dataplus._M_p = (pointer)&local_d30.symbol.field_2;
    local_d30.symbol._M_string_length = 0;
    local_d30.symbol.field_2._M_local_buf[0] = '\0';
    local_d30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_d30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_d30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_d30.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d30.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d30.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_d30.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d30.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d30.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_d30.symbol,0,(char *)0x0,0x1115ef);
    local_d30.priority = 6;
    local_d30.n_arg = 1;
    local_db0.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_d30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_d30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_d30.arg_positions,
                 (iterator)
                 local_d30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_db0);
    }
    else {
      *local_d30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_d30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_d30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_db0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_db0.symbol._M_dataplus._M_p = (pointer)&local_db0.symbol.field_2;
    local_db0.symbol._M_string_length = 0;
    local_db0.symbol.field_2._M_local_buf[0] = '\0';
    local_db0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_db0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_db0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_db0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_db0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_db0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_db0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_db0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_db0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_db0.symbol,0,(char *)0x0,0x1115f3);
    local_db0.priority = 6;
    local_db0.n_arg = 1;
    local_e30.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_db0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_db0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_db0.arg_positions,
                 (iterator)
                 local_db0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_e30);
    }
    else {
      *local_db0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_db0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_db0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_e30.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_e30.symbol._M_dataplus._M_p = (pointer)&local_e30.symbol.field_2;
    local_e30.symbol._M_string_length = 0;
    local_e30.symbol.field_2._M_local_buf[0] = '\0';
    local_e30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_e30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_e30.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e30.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e30.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_e30.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e30.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e30.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_e30.symbol,0,(char *)0x0,0x1115f9);
    local_e30.priority = 6;
    local_e30.n_arg = 0;
    local_230.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_e30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_e30.arg_positions,
                 (iterator)
                 local_e30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_230);
    }
    else {
      *local_e30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_e30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_e30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_230.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_230.symbol._M_dataplus._M_p = (pointer)&local_230.symbol.field_2;
    local_230.symbol._M_string_length = 0;
    local_230.symbol.field_2._M_local_buf[0] = '\0';
    local_230.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_230.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_230.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_230.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_230.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_230.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_230.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_230.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_230.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_230.symbol,0,(char *)0x0,0x1115fe);
    local_230.priority = 5;
    local_230.n_arg = 0;
    local_b0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_b0.symbol._M_dataplus._M_p = (pointer)&local_b0.symbol.field_2;
    local_b0.symbol._M_string_length = 0;
    local_b0.symbol.field_2._M_local_buf[0] = '\0';
    local_b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_b0.symbol,0,(char *)0x0,0x11100e);
    local_b0.priority = 5;
    local_b0.n_arg = 0;
    local_130.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_130.symbol._M_dataplus._M_p = (pointer)&local_130.symbol.field_2;
    local_130.symbol._M_string_length = 0;
    local_130.symbol.field_2._M_local_buf[0] = '\0';
    local_130.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_130.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_130.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_130.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_130.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_130.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_130.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_130.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_130.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_130.symbol,0,(char *)0x0,0x111601);
    local_130.priority = 5;
    local_130.n_arg = 0;
    local_1b0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_1b0.symbol._M_dataplus._M_p = (pointer)&local_1b0.symbol.field_2;
    local_1b0.symbol._M_string_length = 0;
    local_1b0.symbol.field_2._M_local_buf[0] = '\0';
    local_1b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_1b0.symbol,0,(char *)0x0,0x111603);
    local_1b0.priority = 5;
    local_1b0.n_arg = 0;
    local_330.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_330.symbol._M_dataplus._M_p = (pointer)&local_330.symbol.field_2;
    local_330.symbol._M_string_length = 0;
    local_330.symbol.field_2._M_local_buf[0] = '\0';
    local_330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_330.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_330.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_330.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_330.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_330.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_330.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_330.symbol,0,(char *)0x0,0x1115fa);
    local_330.priority = 6;
    local_330.n_arg = 2;
    local_1230.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 0xffffffff;
    if (local_330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_330.arg_positions,
                 (iterator)
                 local_330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_1230);
    }
    else {
      *local_330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = -1;
      local_330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_1230.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_330.arg_positions,
                 (iterator)
                 local_330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_1230);
    }
    else {
      *local_330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_1230.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    local_1230.symbol._M_dataplus._M_p = (pointer)&local_1230.symbol.field_2;
    local_1230.symbol._M_string_length = 0;
    local_1230.symbol.field_2._M_local_buf[0] = '\0';
    local_1230.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1230.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_1230.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_1230.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1230.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1230.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1230.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1230.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1230.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::_M_replace((ulong)&local_1230.symbol,0,(char *)0x0,0x1115e7);
    local_1230.priority = 6;
    local_1230.n_arg = 2;
    local_12b0.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 0xffffffff;
    if (local_1230.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_1230.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_1230.arg_positions,
                 (iterator)
                 local_1230.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_12b0);
    }
    else {
      *local_1230.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = -1;
      local_1230.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_1230.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_12b0.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_1230.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_1230.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_1230.arg_positions,
                 (iterator)
                 local_1230.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_12b0);
    }
    else {
      *local_1230.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_1230.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_1230.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_12b0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    paVar1 = &local_12b0.symbol.field_2;
    local_12b0.symbol._M_string_length = 0;
    local_12b0.symbol.field_2._M_local_buf[0] = '\0';
    local_12b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_12b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_12b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_12b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_12b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_12b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_12b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_12b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_12b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_12b0.symbol._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_replace((ulong)&local_12b0.symbol,0,(char *)0x0,0x111605);
    local_12b0.priority = 6;
    local_12b0.n_arg = 1;
    local_3b0.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_12b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_12b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_12b0.arg_positions,
                 (iterator)
                 local_12b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_3b0);
    }
    else {
      *local_12b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_12b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_12b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_3b0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    paVar2 = &local_3b0.symbol.field_2;
    local_3b0.symbol._M_string_length = 0;
    local_3b0.symbol.field_2._M_local_buf[0] = '\0';
    local_3b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_3b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_3b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_3b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3b0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3b0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3b0.symbol._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_replace((ulong)&local_3b0.symbol,0,(char *)0x0,0x111609);
    local_3b0.priority = 6;
    local_3b0.n_arg = 2;
    local_eb0.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 0xffffffff;
    if (local_3b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_3b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_3b0.arg_positions,
                 (iterator)
                 local_3b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_eb0);
    }
    else {
      *local_3b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = -1;
      local_3b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_3b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_eb0.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_3b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_3b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_3b0.arg_positions,
                 (iterator)
                 local_3b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_eb0);
    }
    else {
      *local_3b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_3b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_3b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_eb0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    paVar3 = &local_eb0.symbol.field_2;
    local_eb0.symbol._M_string_length = 0;
    local_eb0.symbol.field_2._M_local_buf[0] = '\0';
    local_eb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_eb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_eb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_eb0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_eb0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_eb0.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_eb0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_eb0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_eb0.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_eb0.symbol._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_replace((ulong)&local_eb0.symbol,0,(char *)0x0,0x11160d);
    local_eb0.priority = 6;
    local_eb0.n_arg = 2;
    local_f30.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 0xffffffff;
    if (local_eb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_eb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_eb0.arg_positions,
                 (iterator)
                 local_eb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_f30);
    }
    else {
      *local_eb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = -1;
      local_eb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_eb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_f30.super_BaseSpecification._vptr_BaseSpecification._0_4_ = 1;
    if (local_eb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_eb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_eb0.arg_positions,
                 (iterator)
                 local_eb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_f30);
    }
    else {
      *local_eb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_eb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_eb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_f30.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    paVar4 = &local_f30.symbol.field_2;
    local_f30.symbol._M_string_length = 0;
    local_f30.symbol.field_2._M_local_buf[0] = '\0';
    local_f30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_f30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (int *)0x0;
    local_f30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (int *)0x0;
    local_f30.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f30.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f30.pre_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f30.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f30.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f30.post_operators.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_f30.symbol._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_replace((ulong)&local_f30.symbol,0,(char *)0x0,0x111614);
    local_f30.priority = 6;
    local_f30.n_arg = 2;
    local_1334 = -1;
    if (local_f30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_f30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_f30.arg_positions,
                 (iterator)
                 local_f30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_1334);
    }
    else {
      *local_f30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = -1;
      local_f30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_f30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    local_1334 = 1;
    if (local_f30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_f30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_f30.arg_positions,
                 (iterator)
                 local_f30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_1334);
    }
    else {
      *local_f30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish = 1;
      local_f30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_f30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_2b0);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_fb0);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_1030);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_10b0);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_1130);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_11b0);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_1330);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_430);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_4b0);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_530);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_5b0);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_630);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_6b0);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_730);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_7b0);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_830);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_8b0);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_930);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_9b0);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_a30);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_ab0);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_b30);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_bb0);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_c30);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_cb0);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_d30);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_db0);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_e30);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_230);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_b0);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_130);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_1b0);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_330);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_1230);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_12b0);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_3b0);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_eb0);
    std::
    vector<ExprEval::Operator::Specification,_std::allocator<ExprEval::Operator::Specification>_>::
    push_back(specification_table,&local_f30);
    local_f30.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_f30.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_f30.pre_operators);
    if (local_f30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_f30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f30.symbol._M_dataplus._M_p != paVar4) {
      operator_delete(local_f30.symbol._M_dataplus._M_p);
    }
    local_eb0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_eb0.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_eb0.pre_operators);
    if (local_eb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_eb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_eb0.symbol._M_dataplus._M_p != paVar3) {
      operator_delete(local_eb0.symbol._M_dataplus._M_p);
    }
    local_3b0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3b0.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_3b0.pre_operators);
    if (local_3b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0.symbol._M_dataplus._M_p != paVar2) {
      operator_delete(local_3b0.symbol._M_dataplus._M_p);
    }
    local_12b0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_12b0.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_12b0.pre_operators);
    if (local_12b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_12b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_12b0.symbol._M_dataplus._M_p != paVar1) {
      operator_delete(local_12b0.symbol._M_dataplus._M_p);
    }
    local_1230.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1230.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1230.pre_operators);
    if (local_1230.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1230.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1230.symbol._M_dataplus._M_p != &local_1230.symbol.field_2) {
      operator_delete(local_1230.symbol._M_dataplus._M_p);
    }
    local_330.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_330.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_330.pre_operators);
    if (local_330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330.symbol._M_dataplus._M_p != &local_330.symbol.field_2) {
      operator_delete(local_330.symbol._M_dataplus._M_p);
    }
    local_1b0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1b0.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1b0.pre_operators);
    if (local_1b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b0.symbol._M_dataplus._M_p != &local_1b0.symbol.field_2) {
      operator_delete(local_1b0.symbol._M_dataplus._M_p);
    }
    local_130.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_130.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_130.pre_operators);
    if (local_130.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_130.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130.symbol._M_dataplus._M_p != &local_130.symbol.field_2) {
      operator_delete(local_130.symbol._M_dataplus._M_p);
    }
    local_b0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b0.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b0.pre_operators);
    if (local_b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.symbol._M_dataplus._M_p != &local_b0.symbol.field_2) {
      operator_delete(local_b0.symbol._M_dataplus._M_p);
    }
    local_230.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_230.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_230.pre_operators);
    if (local_230.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_230.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230.symbol._M_dataplus._M_p != &local_230.symbol.field_2) {
      operator_delete(local_230.symbol._M_dataplus._M_p);
    }
    local_e30.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_e30.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_e30.pre_operators);
    if (local_e30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e30.symbol._M_dataplus._M_p != &local_e30.symbol.field_2) {
      operator_delete(local_e30.symbol._M_dataplus._M_p);
    }
    local_db0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_db0.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_db0.pre_operators);
    if (local_db0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_db0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_db0.symbol._M_dataplus._M_p != &local_db0.symbol.field_2) {
      operator_delete(local_db0.symbol._M_dataplus._M_p);
    }
    local_d30.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d30.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d30.pre_operators);
    if (local_d30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d30.symbol._M_dataplus._M_p != &local_d30.symbol.field_2) {
      operator_delete(local_d30.symbol._M_dataplus._M_p);
    }
    local_cb0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_cb0.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_cb0.pre_operators);
    if (local_cb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_cb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_cb0.symbol._M_dataplus._M_p != &local_cb0.symbol.field_2) {
      operator_delete(local_cb0.symbol._M_dataplus._M_p);
    }
    local_c30.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c30.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c30.pre_operators);
    if (local_c30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_c30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c30.symbol._M_dataplus._M_p != &local_c30.symbol.field_2) {
      operator_delete(local_c30.symbol._M_dataplus._M_p);
    }
    local_bb0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_bb0.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_bb0.pre_operators);
    if (local_bb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_bb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_bb0.symbol._M_dataplus._M_p != &local_bb0.symbol.field_2) {
      operator_delete(local_bb0.symbol._M_dataplus._M_p);
    }
    local_b30.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b30.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b30.pre_operators);
    if (local_b30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b30.symbol._M_dataplus._M_p != &local_b30.symbol.field_2) {
      operator_delete(local_b30.symbol._M_dataplus._M_p);
    }
    local_ab0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_ab0.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_ab0.pre_operators);
    if (local_ab0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_ab0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_ab0.symbol._M_dataplus._M_p != &local_ab0.symbol.field_2) {
      operator_delete(local_ab0.symbol._M_dataplus._M_p);
    }
    local_a30.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a30.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a30.pre_operators);
    if (local_a30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a30.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a30.symbol._M_dataplus._M_p != &local_a30.symbol.field_2) {
      operator_delete(local_a30.symbol._M_dataplus._M_p);
    }
    local_9b0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_9b0.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_9b0.pre_operators);
    if (local_9b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_9b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9b0.symbol._M_dataplus._M_p != &local_9b0.symbol.field_2) {
      operator_delete(local_9b0.symbol._M_dataplus._M_p);
    }
    local_930.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_930.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_930.pre_operators);
    if (local_930.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_930.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_930.symbol._M_dataplus._M_p != &local_930.symbol.field_2) {
      operator_delete(local_930.symbol._M_dataplus._M_p);
    }
    local_8b0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_8b0.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_8b0.pre_operators);
    if (local_8b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_8b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8b0.symbol._M_dataplus._M_p != &local_8b0.symbol.field_2) {
      operator_delete(local_8b0.symbol._M_dataplus._M_p);
    }
    local_830.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_830.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_830.pre_operators);
    if (local_830.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_830.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_830.symbol._M_dataplus._M_p != &local_830.symbol.field_2) {
      operator_delete(local_830.symbol._M_dataplus._M_p);
    }
    local_7b0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_7b0.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_7b0.pre_operators);
    if (local_7b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_7b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_7b0.symbol._M_dataplus._M_p != &local_7b0.symbol.field_2) {
      operator_delete(local_7b0.symbol._M_dataplus._M_p);
    }
    local_730.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_730.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_730.pre_operators);
    if (local_730.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_730.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_730.symbol._M_dataplus._M_p != &local_730.symbol.field_2) {
      operator_delete(local_730.symbol._M_dataplus._M_p);
    }
    local_6b0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_6b0.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_6b0.pre_operators);
    if (local_6b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_6b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6b0.symbol._M_dataplus._M_p != &local_6b0.symbol.field_2) {
      operator_delete(local_6b0.symbol._M_dataplus._M_p);
    }
    local_630.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_630.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_630.pre_operators);
    if (local_630.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_630.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_630.symbol._M_dataplus._M_p != &local_630.symbol.field_2) {
      operator_delete(local_630.symbol._M_dataplus._M_p);
    }
    local_5b0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_5b0.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_5b0.pre_operators);
    if (local_5b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_5b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0.symbol._M_dataplus._M_p != &local_5b0.symbol.field_2) {
      operator_delete(local_5b0.symbol._M_dataplus._M_p);
    }
    local_530.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_530.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_530.pre_operators);
    if (local_530.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_530.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_530.symbol._M_dataplus._M_p != &local_530.symbol.field_2) {
      operator_delete(local_530.symbol._M_dataplus._M_p);
    }
    local_4b0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_4b0.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_4b0.pre_operators);
    if (local_4b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_4b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b0.symbol._M_dataplus._M_p != &local_4b0.symbol.field_2) {
      operator_delete(local_4b0.symbol._M_dataplus._M_p);
    }
    local_430.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_430.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_430.pre_operators);
    if (local_430.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_430.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_430.symbol._M_dataplus._M_p != &local_430.symbol.field_2) {
      operator_delete(local_430.symbol._M_dataplus._M_p);
    }
    local_1330.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1330.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1330.pre_operators);
    if (local_1330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1330.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1330.symbol._M_dataplus._M_p != &local_1330.symbol.field_2) {
      operator_delete(local_1330.symbol._M_dataplus._M_p);
    }
    local_11b0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_11b0.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_11b0.pre_operators);
    if (local_11b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_11b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_11b0.symbol._M_dataplus._M_p != &local_11b0.symbol.field_2) {
      operator_delete(local_11b0.symbol._M_dataplus._M_p);
    }
    local_1130.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1130.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1130.pre_operators);
    if (local_1130.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1130.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1130.symbol._M_dataplus._M_p != &local_1130.symbol.field_2) {
      operator_delete(local_1130.symbol._M_dataplus._M_p);
    }
    local_10b0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_10b0.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_10b0.pre_operators);
    if (local_10b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_10b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_10b0.symbol._M_dataplus._M_p != &local_10b0.symbol.field_2) {
      operator_delete(local_10b0.symbol._M_dataplus._M_p);
    }
    local_1030.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1030.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1030.pre_operators);
    if (local_1030.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1030.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1030.symbol._M_dataplus._M_p != &local_1030.symbol.field_2) {
      operator_delete(local_1030.symbol._M_dataplus._M_p);
    }
    local_fb0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_fb0.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_fb0.pre_operators);
    if (local_fb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_fb0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_fb0.symbol._M_dataplus._M_p != &local_fb0.symbol.field_2) {
      operator_delete(local_fb0.symbol._M_dataplus._M_p);
    }
    local_2b0.super_BaseSpecification._vptr_BaseSpecification =
         (_func_int **)&PTR__Specification_00115d38;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2b0.post_operators);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2b0.pre_operators);
    if (local_2b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2b0.arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0.symbol._M_dataplus._M_p != &local_2b0.symbol.field_2) {
      operator_delete(local_2b0.symbol._M_dataplus._M_p);
    }
  }
  return specification_table;
}

Assistant:

const std::vector<Operator::Specification>* get_spec_table(){
            if(!specification_table){
                srand(time(0));
                specification_table = new std::vector<Operator::Specification>;

                Operator::Specification spec_add;
                spec_add.symbol = "+";
                spec_add.priority = 9;
                spec_add.n_arg = 2;
                spec_add.arg_positions.push_back(-1);
                spec_add.arg_positions.push_back(1);

                Operator::Specification spec_subtract;
                spec_subtract.symbol = "-";
                spec_subtract.priority = 9;
                spec_subtract.n_arg = 2;
                spec_subtract.arg_positions.push_back(-1);
                spec_subtract.arg_positions.push_back(1);

                Operator::Specification spec_multiply;
                spec_multiply.symbol = "*";
                spec_multiply.priority = 8;
                spec_multiply.n_arg = 2;
                spec_multiply.arg_positions.push_back(-1);
                spec_multiply.arg_positions.push_back(1);

                Operator::Specification spec_divide;
                spec_divide.symbol = "/";
                spec_divide.priority = 8;
                spec_divide.n_arg = 2;
                spec_divide.arg_positions.push_back(-1);
                spec_divide.arg_positions.push_back(1);

                Operator::Specification spec_pow;
                spec_pow.symbol = "^";
                spec_pow.priority = 7;
                spec_pow.n_arg = 2;
                spec_pow.arg_positions.push_back(-1);
                spec_pow.arg_positions.push_back(1);

                Operator::Specification spec_mod;
                spec_mod.symbol = "mod";
                spec_mod.priority = 7;
                spec_mod.n_arg = 2;
                spec_mod.arg_positions.push_back(-1);
                spec_mod.arg_positions.push_back(1);

                Operator::Specification spec_ln;
                spec_ln.symbol = "ln";
                spec_ln.priority = 6;
                spec_ln.n_arg = 1;
                spec_ln.arg_positions.push_back(1);

                Operator::Specification spec_log2;
                spec_log2.symbol = "log2";
                spec_log2.priority = 6;
                spec_log2.n_arg = 1;
                spec_log2.arg_positions.push_back(1);

                Operator::Specification spec_log10;
                spec_log10.symbol = "log";
                spec_log10.priority = 6;
                spec_log10.n_arg = 1;
                spec_log10.arg_positions.push_back(1);

                Operator::Specification spec_sin;
                spec_sin.symbol = "sin";
                spec_sin.priority = 6;
                spec_sin.n_arg = 1;
                spec_sin.arg_positions.push_back(1);

                Operator::Specification spec_cos;
                spec_cos.symbol = "cos";
                spec_cos.priority = 6;
                spec_cos.n_arg = 1;
                spec_cos.arg_positions.push_back(1);

                Operator::Specification spec_tan;
                spec_tan.symbol = "tan";
                spec_tan.priority = 6;
                spec_tan.n_arg = 1;
                spec_tan.arg_positions.push_back(1);

                Operator::Specification spec_cot;
                spec_cot.symbol = "cot";
                spec_cot.priority = 6;
                spec_cot.n_arg = 1;
                spec_cot.arg_positions.push_back(1);

                Operator::Specification spec_sinh;
                spec_sinh.symbol = "sinh";
                spec_sinh.priority = 6;
                spec_sinh.n_arg = 1;
                spec_sinh.arg_positions.push_back(1);

                Operator::Specification spec_cosh;
                spec_cosh.symbol = "cosh";
                spec_cosh.priority = 6;
                spec_cosh.n_arg = 1;
                spec_cosh.arg_positions.push_back(1);

                Operator::Specification spec_tanh;
                spec_tanh.symbol = "tanh";
                spec_tanh.priority = 6;
                spec_tanh.n_arg = 1;
                spec_tanh.arg_positions.push_back(1);

                Operator::Specification spec_asin;
                spec_asin.symbol = "arcsin";
                spec_asin.priority = 6;
                spec_asin.n_arg = 1;
                spec_asin.arg_positions.push_back(1);

                Operator::Specification spec_acos;
                spec_acos.symbol = "arccos";
                spec_acos.priority = 6;
                spec_acos.n_arg = 1;
                spec_acos.arg_positions.push_back(1);

                Operator::Specification spec_atan;
                spec_atan.symbol = "arctan";
                spec_atan.priority = 6;
                spec_atan.n_arg = 1;
                spec_atan.arg_positions.push_back(1);

                Operator::Specification spec_asinh;
                spec_asinh.symbol = "arcsinh";
                spec_asinh.priority = 6;
                spec_asinh.n_arg = 1;
                spec_asinh.arg_positions.push_back(1);

                Operator::Specification spec_acosh;
                spec_acosh.symbol = "arccosh";
                spec_acosh.priority = 6;
                spec_acosh.n_arg = 1;
                spec_acosh.arg_positions.push_back(1);

                Operator::Specification spec_atanh;
                spec_atanh.symbol = "arctanh";
                spec_atanh.priority = 6;
                spec_atanh.n_arg = 1;
                spec_atanh.arg_positions.push_back(1);

                Operator::Specification spec_round;
                spec_round.symbol = "round";
                spec_round.priority = 6;
                spec_round.n_arg = 1;
                spec_round.arg_positions.push_back(1);

                Operator::Specification spec_floor;
                spec_floor.symbol = "floor";
                spec_floor.priority = 6;
                spec_floor.n_arg = 1;
                spec_floor.arg_positions.push_back(1);

                Operator::Specification spec_ceil;
                spec_ceil.symbol = "ceil";
                spec_ceil.priority = 6;
                spec_ceil.n_arg = 1;
                spec_ceil.arg_positions.push_back(1);

                Operator::Specification spec_abs;
                spec_abs.symbol = "abs";
                spec_abs.priority = 6;
                spec_abs.n_arg = 1;
                spec_abs.arg_positions.push_back(1);

                Operator::Specification spec_gamma;
                spec_gamma.symbol = "gamma";
                spec_gamma.priority = 6;
                spec_gamma.n_arg = 1;
                spec_gamma.arg_positions.push_back(1);

                Operator::Specification spec_rand;
                spec_rand.symbol = "rand";
                spec_rand.priority = 6;
                spec_rand.n_arg = 0;
                spec_rand.arg_positions.push_back(1);

                /* Math constants */
                Operator::Specification spec_pi;
                spec_pi.symbol = "pi";
                spec_pi.priority = 5;
                spec_pi.n_arg = 0;

                Operator::Specification spec_e;
                spec_e.symbol = "e";
                spec_e.priority = 5;
                spec_e.n_arg = 0;

                Operator::Specification spec_true;
                spec_true.symbol = "T";
                spec_true.priority = 5;
                spec_true.n_arg = 0;

                Operator::Specification spec_false;
                spec_false.symbol = "F";
                spec_false.priority = 5;
                spec_false.n_arg = 0;
                /* = = = = = = = = */

                Operator::Specification spec_and;
                spec_and.symbol = "and";
                spec_and.priority = 6;
                spec_and.n_arg = 2;
                spec_and.arg_positions.push_back(-1);
                spec_and.arg_positions.push_back(1);

                Operator::Specification spec_or;
                spec_or.symbol = "or";
                spec_or.priority = 6;
                spec_or.n_arg = 2;
                spec_or.arg_positions.push_back(-1);
                spec_or.arg_positions.push_back(1);

                Operator::Specification spec_not;
                spec_not.symbol = "not";
                spec_not.priority = 6;
                spec_not.n_arg = 1;
                spec_not.arg_positions.push_back(1);

                Operator::Specification spec_xor;
                spec_xor.symbol = "xor";
                spec_xor.priority = 6;
                spec_xor.n_arg = 2;
                spec_xor.arg_positions.push_back(-1);
                spec_xor.arg_positions.push_back(1);

                Operator::Specification spec_shiftl;
                spec_shiftl.symbol = "shiftl";
                spec_shiftl.priority = 6;
                spec_shiftl.n_arg = 2;
                spec_shiftl.arg_positions.push_back(-1);
                spec_shiftl.arg_positions.push_back(1);

                Operator::Specification spec_shiftr;
                spec_shiftr.symbol = "shiftr";
                spec_shiftr.priority = 6;
                spec_shiftr.n_arg = 2;
                spec_shiftr.arg_positions.push_back(-1);
                spec_shiftr.arg_positions.push_back(1);

                specification_table->push_back(spec_add);
                specification_table->push_back(spec_subtract);
                specification_table->push_back(spec_multiply);
                specification_table->push_back(spec_divide);
                specification_table->push_back(spec_pow);
                specification_table->push_back(spec_mod);

                specification_table->push_back(spec_ln);
                specification_table->push_back(spec_log2);
                specification_table->push_back(spec_log10);

                specification_table->push_back(spec_sin);
                specification_table->push_back(spec_cos);
                specification_table->push_back(spec_tan);
                specification_table->push_back(spec_cot);

                specification_table->push_back(spec_sinh);
                specification_table->push_back(spec_cosh);
                specification_table->push_back(spec_tanh);
                // specification_table->push_back(spec_coth);

                specification_table->push_back(spec_asin);
                specification_table->push_back(spec_acos);
                specification_table->push_back(spec_atan);
                // specification_table->push_back(spec_acot);

                specification_table->push_back(spec_asinh);
                specification_table->push_back(spec_acosh);
                specification_table->push_back(spec_atanh);
                // specification_table->push_back(spec_acoth);

                specification_table->push_back(spec_round);
                specification_table->push_back(spec_floor);
                specification_table->push_back(spec_ceil);
                specification_table->push_back(spec_abs);
                specification_table->push_back(spec_gamma);
                specification_table->push_back(spec_rand);

                specification_table->push_back(spec_pi);
                specification_table->push_back(spec_e);
                specification_table->push_back(spec_true);
                specification_table->push_back(spec_false);

                specification_table->push_back(spec_and);
                specification_table->push_back(spec_or);
                specification_table->push_back(spec_not);
                specification_table->push_back(spec_xor);
                specification_table->push_back(spec_shiftl);
                specification_table->push_back(spec_shiftr);
            }
            return specification_table;
        }